

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O1

int IDARcheck2(IDAMem IDA_mem)

{
  double dVar1;
  int *piVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  double dVar8;
  double t;
  
  uVar7 = 0;
  if (IDA_mem->ida_irfnd != 0) {
    IDAGetSolution(IDA_mem,IDA_mem->ida_tlo,IDA_mem->ida_yy,IDA_mem->ida_yp);
    iVar5 = (*IDA_mem->ida_gfun)
                      (IDA_mem->ida_tlo,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_glo,
                       IDA_mem->ida_user_data);
    IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
    if (iVar5 == 0) {
      if (0 < IDA_mem->ida_nrtfn) {
        piVar2 = IDA_mem->ida_iroots;
        lVar6 = 0;
        do {
          piVar2[lVar6] = 0;
          lVar6 = lVar6 + 1;
        } while (lVar6 < IDA_mem->ida_nrtfn);
      }
      if (0 < IDA_mem->ida_nrtfn) {
        piVar2 = IDA_mem->ida_gactive;
        lVar6 = 0;
        bVar3 = false;
        do {
          if (((piVar2[lVar6] != 0) && (IDA_mem->ida_glo[lVar6] == 0.0)) &&
             (!NAN(IDA_mem->ida_glo[lVar6]))) {
            IDA_mem->ida_iroots[lVar6] = 1;
            bVar3 = true;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < IDA_mem->ida_nrtfn);
        uVar7 = 0;
        if (bVar3) {
          dVar1 = IDA_mem->ida_hh;
          dVar8 = (ABS(dVar1) + ABS(IDA_mem->ida_tn)) * IDA_mem->ida_uround * 100.0;
          IDA_mem->ida_ttol = dVar8;
          dVar8 = (double)(~-(ulong)(0.0 < dVar1) & (ulong)-dVar8 |
                          (ulong)dVar8 & -(ulong)(0.0 < dVar1));
          t = IDA_mem->ida_tlo + dVar8;
          if (0.0 <= (t - IDA_mem->ida_tn) * dVar1) {
            N_VLinearSum(0x3ff0000000000000,dVar8 / dVar1,IDA_mem->ida_yy,IDA_mem->ida_phi[1],
                         IDA_mem->ida_yy);
          }
          else {
            IDAGetSolution(IDA_mem,t,IDA_mem->ida_yy,IDA_mem->ida_yp);
          }
          iVar5 = (*IDA_mem->ida_gfun)
                            (t,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_ghi,
                             IDA_mem->ida_user_data);
          IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
          uVar7 = 0xfffffff6;
          if ((iVar5 == 0) && (uVar7 = 0, 0 < IDA_mem->ida_nrtfn)) {
            piVar2 = IDA_mem->ida_gactive;
            lVar6 = 0;
            bVar4 = 0;
            do {
              if (piVar2[lVar6] != 0) {
                dVar1 = IDA_mem->ida_ghi[lVar6];
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  if (IDA_mem->ida_iroots[lVar6] == 1) {
                    IDA_mem->ida_glo[lVar6] = dVar1;
                  }
                }
                else {
                  if (IDA_mem->ida_iroots[lVar6] == 1) {
                    return 3;
                  }
                  IDA_mem->ida_iroots[lVar6] = 1;
                  bVar4 = 1;
                }
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < IDA_mem->ida_nrtfn);
            uVar7 = (uint)bVar4;
          }
        }
      }
    }
    else {
      uVar7 = 0xfffffff6;
    }
  }
  return uVar7;
}

Assistant:

static int IDARcheck2(IDAMem IDA_mem)
{
  int i, retval;
  sunrealtype smallh, hratio, tplus;
  sunbooleantype zroot;

  if (IDA_mem->ida_irfnd == 0) { return (IDA_SUCCESS); }

  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_tlo, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);
  retval = IDA_mem->ida_gfun(IDA_mem->ida_tlo, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_glo, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  zroot = SUNFALSE;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++) { IDA_mem->ida_iroots[i] = 0; }
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i]) { continue; }
    if (SUNRabs(IDA_mem->ida_glo[i]) == ZERO)
    {
      zroot                  = SUNTRUE;
      IDA_mem->ida_iroots[i] = 1;
    }
  }
  if (!zroot) { return (IDA_SUCCESS); }

  /* One or more g_i has a zero at tlo.  Check g at tlo+smallh. */
  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);
  smallh = (IDA_mem->ida_hh > ZERO) ? IDA_mem->ida_ttol : -IDA_mem->ida_ttol;
  tplus  = IDA_mem->ida_tlo + smallh;
  if ((tplus - IDA_mem->ida_tn) * IDA_mem->ida_hh >= ZERO)
  {
    hratio = smallh / IDA_mem->ida_hh;
    N_VLinearSum(ONE, IDA_mem->ida_yy, hratio, IDA_mem->ida_phi[1],
                 IDA_mem->ida_yy);
  }
  else
  {
    (void)IDAGetSolution(IDA_mem, tplus, IDA_mem->ida_yy, IDA_mem->ida_yp);
  }
  retval = IDA_mem->ida_gfun(tplus, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  /* Check for close roots (error return), for a new zero at tlo+smallh,
  and for a g_i that changed from zero to nonzero. */
  zroot = SUNFALSE;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i]) { continue; }
    if (SUNRabs(IDA_mem->ida_ghi[i]) == ZERO)
    {
      if (IDA_mem->ida_iroots[i] == 1) { return (CLOSERT); }
      zroot                  = SUNTRUE;
      IDA_mem->ida_iroots[i] = 1;
    }
    else
    {
      if (IDA_mem->ida_iroots[i] == 1)
      {
        IDA_mem->ida_glo[i] = IDA_mem->ida_ghi[i];
      }
    }
  }
  if (zroot) { return (RTFOUND); }
  return (IDA_SUCCESS);
}